

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O1

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::loadFramebuffers_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  _Rb_tree_node_base *__rhs;
  pointer *ppFVar1;
  reference_wrapper<const_yaml::Mapping> rVar2;
  Mapping *this_00;
  Pipeline *pPVar3;
  iterator iVar4;
  Framebuffer *pFVar5;
  pointer pFVar6;
  Loader *pLVar7;
  int iVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  long *plVar10;
  undefined8 *puVar11;
  _Rb_tree_node_base *p_Var12;
  ulong *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar15;
  long lVar16;
  Value *pVVar17;
  size_type sVar18;
  undefined8 uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined8 uVar21;
  int iVar22;
  uint uVar23;
  reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_> rVar24;
  Texture texture;
  Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tex_type_result;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  width_result;
  ExpectedRef<const_Mapping,_std::string> tex_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  height_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pingpong_result;
  Framebuffer fb;
  ExpectedRef<const_Sequence,_std::string> textures_result;
  ExpectedRef<const_Sequence,_std::string> size_result;
  ExpectedRef<const_Mapping,_std::string> yfb_result;
  ExpectedRef<const_Mapping,_std::string> map_fb_result;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  bool local_310 [22];
  byte local_2fa;
  byte local_2f9;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  char local_2b8;
  undefined1 local_2b0 [32];
  bool local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined1 local_280 [32];
  bool local_260;
  Loader *local_258;
  undefined1 local_250 [32];
  bool local_230;
  long *local_228 [2];
  long local_218 [2];
  undefined1 local_208 [32];
  bool local_1e8;
  undefined1 local_1e0 [32];
  bool local_1c0;
  Framebuffer local_1b4;
  undefined1 local_1a0 [32];
  bool local_180;
  anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_178;
  char local_158;
  long local_150;
  undefined1 local_148 [32];
  bool local_128;
  _Base_ptr local_120;
  anon_struct_48_2_fed59856_for_indexes_ *local_118;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_110;
  undefined4 local_108;
  undefined4 local_104;
  Value *local_100;
  undefined1 local_f8 [32];
  char local_d8;
  Value *local_d0;
  _Rb_tree_node_base *local_c8;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  PixelType local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  PixelType local_88;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  PixelType local_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = this->root_;
  local_330._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"framebuffers","");
  yaml::Mapping::getMapping
            ((ExpectedRef<const_Mapping,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_f8)->value_,this_00,(string *)local_330);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320) {
    operator_delete((void *)local_330._0_8_,(ulong)(local_320._M_allocated_capacity + 1));
  }
  if (local_d8 == '\0') {
    local_330._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_330,local_f8._0_8_,(undefined1 *)(local_f8._8_8_ + local_f8._0_8_));
    paVar20 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar20;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320) {
      paVar20->_M_allocated_capacity = local_320._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_320._8_8_;
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->field_0 = local_330._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_320._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_330._8_8_;
    local_330._8_8_ = 0;
    local_320._M_allocated_capacity = local_320._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->has_value_ = false;
    local_330._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
  }
  else {
    p_Var12 = *(_Rb_tree_node_base **)(local_f8._0_8_ + 0x18);
    local_c8 = (_Rb_tree_node_base *)(local_f8._0_8_ + 8);
    if (p_Var12 != local_c8) {
      local_110 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->names_
      ;
      local_288 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      local_118 = &this->indexes_;
      local_258 = this;
      do {
        pLVar7 = local_258;
        rVar24._M_data =
             (vector<yaml::Value,_std::allocator<yaml::Value>_> *)((long)&local_178 + 0x10);
        __rhs = p_Var12 + 1;
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((local_258->names_).framebuffer.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (local_258->names_).framebuffer.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__rhs);
        if (_Var9._M_current ==
            (pLVar7->names_).framebuffer.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          yaml::Value::getMapping_abi_cxx11_
                    ((ExpectedRef<const_Mapping,_std::string> *)local_148,(Value *)(p_Var12 + 2));
          uVar19 = local_148._0_8_;
          if (local_128 == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280,"Framebuffer ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_280);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar20) {
              local_178._16_8_ = paVar20->_M_allocated_capacity;
              local_178._24_8_ = puVar11[3];
              local_178.value_._M_data =
                   (reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                   )rVar24._M_data;
            }
            else {
              local_178._16_8_ = paVar20->_M_allocated_capacity;
              local_178.value_._M_data =
                   (reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                   )(vector<yaml::Value,_std::allocator<yaml::Value>_> *)*puVar11;
            }
            local_320._M_allocated_capacity = local_178._16_8_;
            sVar18 = puVar11[1];
            *puVar11 = paVar20;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            if (local_178.value_._M_data ==
                (reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>)
                rVar24._M_data) {
              local_320._8_8_ = local_178._24_8_;
              local_330._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
            }
            else {
              local_330._0_8_ = local_178.value_._M_data;
            }
            local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_0 = local_288;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320)
            {
              local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
              *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   (pointer)local_330._0_8_;
              (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                   local_320._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
            local_320._M_allocated_capacity = local_320._M_allocated_capacity & 0xffffffffffffff00;
            __return_storage_ptr__->has_value_ = false;
            local_178.error_.error_._M_string_length = 0;
            local_330._8_8_ = 0;
            local_330._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
            local_178._0_8_ = rVar24._M_data;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_280 + 0x10)) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
            iVar22 = 1;
          }
          else {
            if ((long)(local_258->names_).framebuffer.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_258->names_).framebuffer.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5 !=
                ((long)(local_258->pipeline_->framebuffers).
                       super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_258->pipeline_->framebuffers).
                       super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333) {
              __assert_fail("framebuffer_index == pipeline_.framebuffers.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                            ,0x99,
                            "Expected<void, std::string> renderdesc::Loader::loadFramebuffers()");
            }
            local_330._0_8_ = &local_320;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"size","");
            yaml::Mapping::getSequence
                      ((ExpectedRef<const_Sequence,_std::string> *)&local_178.value_,
                       (Mapping *)uVar19,(string *)local_330);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320)
            {
              operator_delete((void *)local_330._0_8_,(ulong)(local_320._M_allocated_capacity + 1));
            }
            uVar21 = local_178.value_._M_data;
            if (local_158 == '\0') {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e0,"Cannot read size for framebuffer ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_1e0);
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_280 + 0x10);
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar14) {
                local_208._16_8_ = paVar14->_M_allocated_capacity;
                local_208._24_8_ = puVar11[3];
                local_208._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_208 + 0x10);
              }
              else {
                local_208._16_8_ = paVar14->_M_allocated_capacity;
                local_208._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar11;
              }
              local_208._8_8_ = puVar11[1];
              *puVar11 = paVar14;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              if (local_158 == '\x01') {
                aAppDebugPrintf("[CRASH] Expected has value");
                aAppTerminate(-1);
              }
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_208,(ulong)local_178.value_._M_data);
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar14) {
                local_280._16_8_ = paVar14->_M_allocated_capacity;
                local_280._24_8_ = puVar11[3];
                local_280._0_8_ = paVar20;
              }
              else {
                local_280._16_8_ = paVar14->_M_allocated_capacity;
                local_280._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar11;
              }
              local_320._M_allocated_capacity = local_280._16_8_;
              sVar18 = puVar11[1];
              *puVar11 = paVar14;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._0_8_ == paVar20) {
                local_320._8_8_ = local_280._24_8_;
                local_330._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                ;
              }
              else {
                local_330._0_8_ = local_280._0_8_;
              }
              local_280._16_8_ = local_280._16_8_ & 0xffffffffffffff00;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&__return_storage_ptr__->field_0 = local_288;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_330._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320) {
                local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
              }
              else {
                (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                     (pointer)local_330._0_8_;
                (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                     local_320._M_allocated_capacity;
              }
              (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
              local_320._M_allocated_capacity = local_320._M_allocated_capacity & 0xffffffffffffff00
              ;
              __return_storage_ptr__->has_value_ = false;
              local_280._8_8_ = 0;
              local_330._8_8_ = 0;
              local_330._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
              local_280._0_8_ = paVar20;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_208 + 0x10)) {
                operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
              }
              sVar18 = local_1e0._16_8_;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e0._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1e0 + 0x10)) {
LAB_0012aec2:
                operator_delete(paVar20,sVar18 + 1);
              }
LAB_0012aeca:
              iVar22 = 1;
            }
            else {
              if (*(long *)((long)local_178.value_._M_data + 8) -
                  *(size_type *)local_178.value_._M_data != 0xe0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_208,"Framebuffer ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_208);
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_280 + 0x10);
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 == paVar20) {
                  local_280._16_8_ = paVar20->_M_allocated_capacity;
                  local_280._24_8_ = puVar11[3];
                  local_280._0_8_ = paVar14;
                }
                else {
                  local_280._16_8_ = paVar20->_M_allocated_capacity;
                  local_280._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar11;
                }
                local_320._M_allocated_capacity = local_280._16_8_;
                sVar18 = puVar11[1];
                *puVar11 = paVar20;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._0_8_ == paVar14) {
                  local_320._8_8_ = local_280._24_8_;
                  local_330._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_320;
                }
                else {
                  local_330._0_8_ = local_280._0_8_;
                }
                local_280._16_8_ = local_280._16_8_ & 0xffffffffffffff00;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&__return_storage_ptr__->field_0 = local_288;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320)
                {
                  local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                  *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                }
                else {
                  (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                       (pointer)local_330._0_8_;
                  (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                       local_320._M_allocated_capacity;
                }
                (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
                local_320._M_allocated_capacity =
                     local_320._M_allocated_capacity & 0xffffffffffffff00;
                __return_storage_ptr__->has_value_ = false;
                local_280._8_8_ = 0;
                local_330._8_8_ = 0;
                sVar18 = local_208._16_8_;
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_208._0_8_;
                local_330._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                ;
                local_280._0_8_ = paVar14;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_208 + 0x10)) goto LAB_0012aec2;
                goto LAB_0012aeca;
              }
              yaml::Value::getInt_abi_cxx11_
                        ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_280,*(Value **)local_178.value_._M_data);
              if (local_260 == false) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a0,"Cannot read width for framebuffer ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_1a0);
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_208 + 0x10);
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 == paVar14) {
                  local_1e0._16_8_ = paVar14->_M_allocated_capacity;
                  local_1e0._24_8_ = puVar11[3];
                  local_1e0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_1e0 + 0x10);
                }
                else {
                  local_1e0._16_8_ = paVar14->_M_allocated_capacity;
                  local_1e0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar11;
                }
                local_1e0._8_8_ = puVar11[1];
                *puVar11 = paVar14;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                if (local_260 == true) {
                  aAppDebugPrintf("[CRASH] Expected has value");
                  aAppTerminate(-1);
                }
                puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_1e0,local_280._0_8_);
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 == paVar14) {
                  local_208._16_8_ = paVar14->_M_allocated_capacity;
                  local_208._24_8_ = puVar11[3];
                  local_208._0_8_ = paVar20;
                }
                else {
                  local_208._16_8_ = paVar14->_M_allocated_capacity;
                  local_208._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar11;
                }
                local_320._M_allocated_capacity = local_208._16_8_;
                sVar18 = puVar11[1];
                *puVar11 = paVar14;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._0_8_ == paVar20) {
                  local_320._8_8_ = local_208._24_8_;
                  local_330._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_320;
                }
                else {
                  local_330._0_8_ = local_208._0_8_;
                }
                local_208._16_8_ = local_208._16_8_ & 0xffffffffffffff00;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&__return_storage_ptr__->field_0 = local_288;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320)
                {
                  local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                  *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                }
                else {
                  (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                       (pointer)local_330._0_8_;
                  (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                       local_320._M_allocated_capacity;
                }
                (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
                local_320._M_allocated_capacity =
                     local_320._M_allocated_capacity & 0xffffffffffffff00;
                __return_storage_ptr__->has_value_ = false;
                local_208._8_8_ = 0;
                local_330._8_8_ = 0;
                local_330._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                ;
                local_208._0_8_ = paVar20;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_1e0 + 0x10)) {
                  operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                }
                if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_1a0._0_8_ !=
                    (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_1a0 + 0x10)) {
                  operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
                }
                iVar22 = 1;
              }
              else {
                local_104 = local_280._0_4_;
                yaml::Value::getInt_abi_cxx11_
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_208,(Value *)(*(size_type *)uVar21 + 0x70));
                if (local_1e8 == false) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,"Cannot read height for framebuffer ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
                  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_250);
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_1e0 + 0x10);
                  pvVar15 = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(puVar11 + 2);
                  if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)*puVar11 == pvVar15) {
                    local_1a0._16_8_ =
                         (pvVar15->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                    local_1a0._24_4_ = *(undefined4 *)(puVar11 + 3);
                    local_1a0._28_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
                    local_1a0._0_8_ =
                         (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_1a0 + 0x10);
                  }
                  else {
                    local_1a0._16_8_ =
                         (pvVar15->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                    local_1a0._0_8_ = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)*puVar11;
                  }
                  local_1a0._8_8_ = puVar11[1];
                  *puVar11 = pvVar15;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  if (local_1e8 == true) {
                    aAppDebugPrintf("[CRASH] Expected has value");
                    aAppTerminate(-1);
                  }
                  puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_1a0,local_208._0_8_)
                  ;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar14) {
                    local_1e0._16_8_ = paVar14->_M_allocated_capacity;
                    local_1e0._24_8_ = puVar11[3];
                    local_1e0._0_8_ = paVar20;
                  }
                  else {
                    local_1e0._16_8_ = paVar14->_M_allocated_capacity;
                    local_1e0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar11;
                  }
                  local_320._M_allocated_capacity = local_1e0._16_8_;
                  sVar18 = puVar11[1];
                  *puVar11 = paVar14;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._0_8_ == paVar20) {
                    local_320._8_8_ = local_1e0._24_8_;
                    local_330._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_320;
                  }
                  else {
                    local_330._0_8_ = local_1e0._0_8_;
                  }
                  local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)&__return_storage_ptr__->field_0 = local_288;
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_330._0_8_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_320) {
                    local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                    *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                         (pointer)local_330._0_8_;
                    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                         local_320._M_allocated_capacity;
                  }
                  (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
                  local_320._M_allocated_capacity =
                       local_320._M_allocated_capacity & 0xffffffffffffff00;
                  __return_storage_ptr__->has_value_ = false;
                  local_1e0._8_8_ = 0;
                  local_330._8_8_ = 0;
                  local_330._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_320;
                  local_1e0._0_8_ = paVar20;
                  if ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_1a0._0_8_ !=
                      (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_1a0 + 0x10)) {
                    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
                  }
                  if ((Mapping *)local_250._0_8_ != (Mapping *)(local_250 + 0x10)) {
                    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                  }
                  iVar22 = 1;
                }
                else {
                  local_108 = local_208._0_4_;
                  local_330._0_8_ = &local_320;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"pingpong","")
                  ;
                  yaml::Mapping::getInt
                            ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1e0,(Mapping *)uVar19,(string *)local_330);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_330._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_320) {
                    operator_delete((void *)local_330._0_8_,
                                    (ulong)(local_320._M_allocated_capacity + 1));
                  }
                  local_2f9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e0._0_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0 & local_1c0;
                  local_330._0_8_ = &local_320;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"textures","")
                  ;
                  yaml::Mapping::getSequence
                            ((ExpectedRef<const_Sequence,_std::string> *)local_1a0,(Mapping *)uVar19
                             ,(string *)local_330);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_330._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_320) {
                    operator_delete((void *)local_330._0_8_,
                                    (ulong)(local_320._M_allocated_capacity + 1));
                  }
                  if (local_180 == false) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2b0,"Cannot read target textures for framebuffer ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
                    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_2b0);
                    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11 == paVar20) {
                      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
                      local_2c8._8_8_ = puVar11[3];
                      local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                    }
                    else {
                      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
                      local_2d8._M_allocated_capacity =
                           (size_type)
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*puVar11;
                    }
                    local_2d8._8_8_ = puVar11[1];
                    *puVar11 = paVar20;
                    puVar11[1] = 0;
                    *(undefined1 *)(puVar11 + 2) = 0;
                    if (local_180 == true) {
                      aAppDebugPrintf("[CRASH] Expected has value");
                      aAppTerminate(-1);
                    }
                    puVar11 = (undefined8 *)
                              std::__cxx11::string::_M_append
                                        (local_2d8._M_local_buf,local_1a0._0_8_);
                    rVar2._M_data = (Mapping *)(local_250 + 0x10);
                    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11 == paVar20) {
                      local_250._16_8_ = paVar20->_M_allocated_capacity;
                      local_250._24_8_ = puVar11[3];
                      local_250._0_8_ = rVar2._M_data;
                    }
                    else {
                      local_250._16_8_ = paVar20->_M_allocated_capacity;
                      local_250._0_8_ = (Mapping *)*puVar11;
                    }
                    local_320._M_allocated_capacity = local_250._16_8_;
                    sVar18 = puVar11[1];
                    *puVar11 = paVar20;
                    puVar11[1] = 0;
                    *(undefined1 *)(puVar11 + 2) = 0;
                    if ((Mapping *)local_250._0_8_ == rVar2._M_data) {
                      local_320._8_8_ = local_250._24_8_;
                      local_330._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_320;
                    }
                    else {
                      local_330._0_8_ = local_250._0_8_;
                    }
                    local_250._16_8_ = local_250._16_8_ & 0xffffffffffffff00;
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)&__return_storage_ptr__->field_0 = local_288;
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_330._0_8_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_320) {
                      local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                      *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                           (pointer)local_330._0_8_;
                      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity
                           = local_320._M_allocated_capacity;
                    }
                    (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
                    local_320._M_allocated_capacity =
                         local_320._M_allocated_capacity & 0xffffffffffffff00;
                    __return_storage_ptr__->has_value_ = false;
                    local_250._8_8_ = 0;
                    local_330._8_8_ = 0;
                    local_330._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_320;
                    local_250._0_8_ = rVar2._M_data;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d8._M_allocated_capacity != &local_2c8) {
                      operator_delete((void *)local_2d8._M_allocated_capacity,
                                      local_2c8._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                    }
                    iVar22 = 1;
                  }
                  else {
                    local_1b4.textures_count = 0;
                    pVVar17 = *(Value **)local_1a0._0_8_;
                    local_d0 = *(pointer *)(local_1a0._0_8_ + 8);
                    iVar22 = 4;
                    local_2fa = pVVar17 == local_d0;
                    while (!(bool)local_2fa) {
                      yaml::Value::getMapping_abi_cxx11_
                                ((ExpectedRef<const_Mapping,_std::string> *)local_250,pVVar17);
                      if (local_230 == false) {
                        format_abi_cxx11_((string *)&local_2d8,
                                          "%dth texture of framebuffer %s is not a mapping",
                                          (ulong)(uint)local_1b4.textures_count,*(undefined8 *)__rhs
                                         );
LAB_0012b5e6:
                        local_320._M_allocated_capacity = local_2c8._M_allocated_capacity;
                        uVar19 = local_2d8._8_8_;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d8._M_allocated_capacity == &local_2c8) {
                          local_320._8_8_ = local_2c8._8_8_;
                          local_330._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_320;
                        }
                        else {
                          local_330._0_8_ = local_2d8._M_allocated_capacity;
                        }
                        local_2d8._8_8_ = 0;
                        local_2c8._M_allocated_capacity =
                             local_2c8._M_allocated_capacity & 0xffffffffffffff00;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_288;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_320) {
                          local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                          *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               (pointer)local_330._0_8_;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_320._M_allocated_capacity;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar19;
                        local_330._8_8_ = 0;
                        local_320._M_allocated_capacity =
                             local_320._M_allocated_capacity & 0xffffffffffffff00;
                        __return_storage_ptr__->has_value_ = false;
                        local_330._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_320;
                        local_2d8._M_allocated_capacity = (size_type)&local_2c8;
LAB_0012b9a8:
                        if ((local_230 == false) &&
                           ((Mapping *)local_250._0_8_ != (Mapping *)(local_250 + 0x10))) {
                          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                        }
                        iVar22 = 1;
                        break;
                      }
                      if (*(size_t *)(local_250._0_8_ + 0x28) != 1) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2b0,"Framebuffer ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
                        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_2b0);
                        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(puVar11 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar11 == paVar20) {
                          local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
                          local_2c8._8_8_ = puVar11[3];
                          local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                        }
                        else {
                          local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
                          local_2d8._M_allocated_capacity =
                               (size_type)
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)*puVar11;
                        }
                        local_320._M_allocated_capacity = local_2c8._M_allocated_capacity;
                        sVar18 = puVar11[1];
                        *puVar11 = paVar20;
                        puVar11[1] = 0;
                        *(undefined1 *)(puVar11 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d8._M_allocated_capacity == &local_2c8) {
                          local_320._8_8_ = local_2c8._8_8_;
                          local_330._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_320;
                        }
                        else {
                          local_330._0_8_ = local_2d8._M_allocated_capacity;
                        }
                        local_2c8._M_allocated_capacity =
                             local_2c8._M_allocated_capacity & 0xffffffffffffff00;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_288;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_320) {
                          local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                          *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               (pointer)local_330._0_8_;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_320._M_allocated_capacity;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar18;
                        local_320._M_allocated_capacity =
                             local_320._M_allocated_capacity & 0xffffffffffffff00;
                        __return_storage_ptr__->has_value_ = false;
                        local_2d8._8_8_ = 0;
                        local_330._8_8_ = 0;
                        uVar19 = local_2b0._16_8_;
                        uVar21 = local_2b0._0_8_;
                        local_330._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_320;
                        local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                        if ((undefined1 *)local_2b0._0_8_ == local_2b0 + 0x10) goto LAB_0012b9a8;
LAB_0012b9a0:
                        operator_delete((void *)uVar21,uVar19 + 1);
                        goto LAB_0012b9a8;
                      }
                      if (3 < local_1b4.textures_count) {
                        format_abi_cxx11_((string *)&local_2d8,
                                          "Too many targets for framebuffer %s, max: %d",
                                          *(undefined8 *)__rhs,4);
                        goto LAB_0012b5e6;
                      }
                      local_120 = *(_Base_ptr *)(local_250._0_8_ + 0x18);
                      yaml::Value::getString_abi_cxx11_
                                ((ExpectedRef<const_std::string,_std::string> *)local_330,
                                 (Value *)(local_120 + 2));
                      uVar19 = local_330._0_8_;
                      local_100 = pVVar17;
                      if (local_310[0] == false) {
                        std::operator+(&local_2f8,"Cannot read PixelType: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_330);
LAB_0012a22a:
                        local_2c8._M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
                        local_2d8._8_8_ = local_2f8._M_string_length;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) {
                          local_2b0._24_8_ =
                               CONCAT44(local_2f8.field_2._12_4_,local_2f8.field_2._8_4_);
                          local_2b0._0_8_ = local_2b0 + 0x10;
                        }
                        else {
                          local_2b0._0_8_ = local_2f8._M_dataplus._M_p;
                        }
                        local_2f8._M_string_length = 0;
                        local_2f8.field_2._M_allocated_capacity =
                             local_2f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                        if ((undefined1 *)local_2b0._0_8_ == local_2b0 + 0x10) {
                          local_2c8._8_8_ = local_2b0._24_8_;
                        }
                        else {
                          local_2d8._M_allocated_capacity = local_2b0._0_8_;
                        }
                        local_2b0._8_8_ = 0;
                        local_2b0._16_8_ = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
                        local_2b8 = '\0';
                        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)local_330._0_8_);
                        if (iVar8 == 0) {
                          local_2d8._M_allocated_capacity =
                               local_2d8._M_allocated_capacity & 0xffffffff00000000;
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)uVar19);
                          if (iVar8 == 0) {
                            local_2d8._M_allocated_capacity._0_4_ = 1;
                          }
                          else {
                            iVar8 = std::__cxx11::string::compare((char *)uVar19);
                            if (iVar8 != 0) {
                              format_abi_cxx11_(&local_2f8,"Unexpected pixel type %s",
                                                *(size_type *)uVar19);
                              goto LAB_0012a22a;
                            }
                            local_2d8._M_allocated_capacity._0_4_ = 2;
                          }
                        }
                        local_2b8 = '\x01';
                      }
                      if ((local_310[0] == false) &&
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_330._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_320)) {
                        operator_delete((void *)local_330._0_8_,
                                        (ulong)(local_320._M_allocated_capacity + 1));
                      }
                      if (local_2b8 == '\0') {
                        format_abi_cxx11_((string *)local_2b0,
                                          "Framebuffer %s texture %d has invalid pixel type: %s",
                                          *(undefined8 *)__rhs,(ulong)(uint)local_1b4.textures_count
                                          ,local_2d8._M_allocated_capacity);
                        local_320._M_allocated_capacity = local_2b0._16_8_;
                        uVar19 = local_2b0._8_8_;
                        if ((undefined1 *)local_2b0._0_8_ == local_2b0 + 0x10) {
                          local_320._8_8_ = local_2b0._24_8_;
                          local_330._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_320;
                        }
                        else {
                          local_330._0_8_ = local_2b0._0_8_;
                        }
                        local_2b0._8_8_ = 0;
                        local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffffffffff00;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_288;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_320) {
                          local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
                          *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               (pointer)local_330._0_8_;
                          *(size_type *)((long)&__return_storage_ptr__->field_0 + 0x10) =
                               local_320._M_allocated_capacity;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar19;
                        local_330._8_8_ = 0;
                        local_320._M_allocated_capacity =
                             local_320._M_allocated_capacity & 0xffffffffffffff00;
                        __return_storage_ptr__->has_value_ = false;
                        local_330._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_320;
                        local_2b0._0_8_ = local_2b0 + 0x10;
LAB_0012b987:
                        if ((local_2b8 != '\0') ||
                           (uVar19 = local_2c8._M_allocated_capacity,
                           uVar21 = local_2d8._M_allocated_capacity,
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_2d8._M_allocated_capacity == &local_2c8)) goto LAB_0012b9a8;
                        goto LAB_0012b9a0;
                      }
                      local_150 = (long)(local_258->names_).texture.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_258->names_).texture.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5;
                      if (local_150 !=
                          ((long)(local_258->pipeline_->textures).
                                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_258->pipeline_->textures).
                                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          -0x5555555555555555) {
                        __assert_fail("tex_index == pipeline_.textures.size()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                                      ,0xca,
                                      "Expected<void, std::string> renderdesc::Loader::loadFramebuffers()"
                                     );
                      }
                      local_330._4_4_ = local_108;
                      local_330._0_4_ = local_104;
                      local_330._8_4_ = local_2d8._M_allocated_capacity._0_4_;
                      local_320._M_allocated_capacity = (size_type)local_310;
                      local_320._8_8_ = 0;
                      local_310[0] = false;
                      local_228[0] = local_218;
                      if (local_2f9 != 0) {
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_228,*(long *)(p_Var12 + 1),
                                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1))
                        ;
                        std::__cxx11::string::append((char *)local_228);
                        plVar10 = (long *)std::__cxx11::string::_M_append
                                                    ((char *)local_228,*(ulong *)(local_120 + 1));
                        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                        puVar13 = (ulong *)(plVar10 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar10 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)puVar13) {
                          local_2f8.field_2._M_allocated_capacity = *puVar13;
                          local_2f8.field_2._8_4_ = (undefined4)plVar10[3];
                          local_2f8.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
                        }
                        else {
                          local_2f8.field_2._M_allocated_capacity = *puVar13;
                          local_2f8._M_dataplus._M_p = (pointer)*plVar10;
                        }
                        local_2f8._M_string_length = plVar10[1];
                        *plVar10 = (long)puVar13;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        local_58 = local_330._8_4_;
                        local_60._M_data =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_330._0_8_;
                        local_50._M_p = (pointer)&local_40;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_50,local_320._M_allocated_capacity,
                                   (bool *)(local_320._8_8_ + local_320._M_allocated_capacity));
                        registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_2b0,local_258,(int)local_150,Ping,&local_2f8,
                                        (Texture *)&local_60);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_50._M_p != &local_40) {
                          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                          operator_delete(local_2f8._M_dataplus._M_p,
                                          local_2f8.field_2._M_allocated_capacity + 1);
                        }
                        if (local_228[0] != local_218) {
                          operator_delete(local_228[0],local_218[0] + 1);
                        }
                        if (local_290 == false) {
                          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_2f8,local_2b0._0_8_,
                                     (pointer)(local_2b0._8_8_ + local_2b0._0_8_));
                        }
                        else {
                          local_228[0] = local_218;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_228,*(long *)(p_Var12 + 1),
                                     (long)&(p_Var12[1]._M_parent)->_M_color +
                                     *(long *)(p_Var12 + 1));
                          std::__cxx11::string::append((char *)local_228);
                          puVar11 = (undefined8 *)
                                    std::__cxx11::string::_M_append
                                              ((char *)local_228,*(ulong *)(local_120 + 1));
                          pVVar17 = local_100;
                          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)(puVar11 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*puVar11 == paVar20) {
                            local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity
                            ;
                            local_2f8.field_2._8_4_ = *(undefined4 *)(puVar11 + 3);
                            local_2f8.field_2._12_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
                          }
                          else {
                            local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity
                            ;
                            local_2f8._M_dataplus._M_p = (pointer)*puVar11;
                          }
                          local_2f8._M_string_length = puVar11[1];
                          *puVar11 = paVar20;
                          puVar11[1] = 0;
                          *(undefined1 *)(puVar11 + 2) = 0;
                          local_88 = local_330._8_4_;
                          local_90._M_data =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_330._0_8_;
                          local_80._M_p = (pointer)&local_70;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_80,local_320._M_allocated_capacity,
                                     (bool *)(local_320._8_8_ + local_320._M_allocated_capacity));
                          registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_2b0,local_258,(int)local_150,Pong,&local_2f8,
                                          (Texture *)&local_90);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_80._M_p != &local_70) {
                            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                            operator_delete(local_2f8._M_dataplus._M_p,
                                            local_2f8.field_2._M_allocated_capacity + 1);
                          }
                          if (local_228[0] != local_218) {
                            operator_delete(local_228[0],local_218[0] + 1);
                          }
                          if (local_290 != false) goto LAB_0012a838;
                          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_2f8,local_2b0._0_8_,
                                     (pointer)(local_2b0._8_8_ + local_2b0._0_8_));
                        }
LAB_0012b768:
                        paVar20 = &local_2f8.field_2;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&__return_storage_ptr__->field_0 = local_288;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._M_dataplus._M_p == paVar20) {
                          local_288->_M_allocated_capacity = local_2f8.field_2._M_allocated_capacity
                          ;
                          *(ulong *)((long)local_288 + 8) =
                               CONCAT44(local_2f8.field_2._12_4_,local_2f8.field_2._8_4_);
                        }
                        else {
                          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                               local_2f8._M_dataplus._M_p;
                          (__return_storage_ptr__->field_0).error_.error_.field_2.
                          _M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
                        }
                        (__return_storage_ptr__->field_0).error_.error_._M_string_length =
                             local_2f8._M_string_length;
                        local_2f8._M_string_length = 0;
                        local_2f8.field_2._M_allocated_capacity =
                             local_2f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        __return_storage_ptr__->has_value_ = false;
                        local_2f8._M_dataplus._M_p = (pointer)paVar20;
                        if ((local_290 == false) &&
                           ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10)) {
                          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                        }
                        if ((bool *)local_320._M_allocated_capacity != local_310) {
                          operator_delete((void *)local_320._M_allocated_capacity,
                                          CONCAT71(local_310._1_7_,local_310[0]) + 1);
                        }
                        goto LAB_0012b987;
                      }
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_228,*(long *)(p_Var12 + 1),
                                 (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                      std::__cxx11::string::append((char *)local_228);
                      puVar11 = (undefined8 *)
                                std::__cxx11::string::_M_append
                                          ((char *)local_228,*(ulong *)(local_120 + 1));
                      pVVar17 = local_100;
                      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar11 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11 == paVar20) {
                        local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                        local_2f8.field_2._8_4_ = *(undefined4 *)(puVar11 + 3);
                        local_2f8.field_2._12_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
                      }
                      else {
                        local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
                        local_2f8._M_dataplus._M_p = (pointer)*puVar11;
                      }
                      local_2f8._M_string_length = puVar11[1];
                      *puVar11 = paVar20;
                      puVar11[1] = 0;
                      *(undefined1 *)(puVar11 + 2) = 0;
                      local_b8 = local_330._8_4_;
                      local_c0._M_data =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_330._0_8_;
                      local_b0._M_p = (pointer)&local_a0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_b0,local_320._M_allocated_capacity,
                                 (bool *)(local_320._8_8_ + local_320._M_allocated_capacity));
                      registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_2b0,local_258,(int)local_150,Fixed,&local_2f8,
                                      (Texture *)&local_c0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b0._M_p != &local_a0) {
                        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                        operator_delete(local_2f8._M_dataplus._M_p,
                                        local_2f8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_228[0] != local_218) {
                        operator_delete(local_228[0],local_218[0] + 1);
                      }
                      if (local_290 == false) {
                        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_2f8,local_2b0._0_8_,
                                   (pointer)(local_2b0._8_8_ + local_2b0._0_8_));
                        goto LAB_0012b768;
                      }
LAB_0012a838:
                      local_1b4.textures[local_1b4.textures_count] = (int)local_150;
                      local_1b4.textures_count = local_1b4.textures_count + 1;
                      if ((bool *)local_320._M_allocated_capacity != local_310) {
                        operator_delete((void *)local_320._M_allocated_capacity,
                                        CONCAT71(local_310._1_7_,local_310[0]) + 1);
                      }
                      if ((local_2b8 == '\0') &&
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2d8._M_allocated_capacity != &local_2c8)) {
                        operator_delete((void *)local_2d8._M_allocated_capacity,
                                        local_2c8._M_allocated_capacity + 1);
                      }
                      if ((local_230 == false) &&
                         ((Mapping *)local_250._0_8_ != (Mapping *)(local_250 + 0x10))) {
                        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                      }
                      pVVar17 = pVVar17 + 1;
                      local_2fa = pVVar17 == local_d0;
                    }
                    if ((local_2fa & 1) != 0) {
                      pPVar3 = local_258->pipeline_;
                      iVar4._M_current =
                           (pPVar3->framebuffers).
                           super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      pFVar5 = (pPVar3->framebuffers).
                               super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      uVar23 = (int)((ulong)((long)iVar4._M_current -
                                            (long)(pPVar3->framebuffers).
                                                  super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x33333333;
                      if (local_2f9 == 0) {
                        if (iVar4._M_current == pFVar5) {
                          std::
                          vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                          _M_realloc_insert<renderdesc::Framebuffer_const&>
                                    ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                      *)&pPVar3->framebuffers,iVar4,&local_1b4);
                        }
                        else {
                          (iVar4._M_current)->textures[3] = local_1b4.textures[3];
                          (iVar4._M_current)->textures_count = local_1b4.textures_count;
                          (iVar4._M_current)->textures[0] = local_1b4.textures[0];
                          *(undefined8 *)((iVar4._M_current)->textures + 1) =
                               local_1b4.textures._4_8_;
                          ppFVar1 = &(pPVar3->framebuffers).
                                     super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppFVar1 = *ppFVar1 + 1;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_110,(value_type *)__rhs);
                        local_330._4_4_ = 0;
                        local_330._0_4_ = uVar23;
                        std::
                        vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                        ::emplace_back<renderdesc::Command::Index>
                                  (&local_118->framebuffer,(Index *)local_330);
                      }
                      else {
                        if (iVar4._M_current == pFVar5) {
                          std::
                          vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                          _M_realloc_insert<renderdesc::Framebuffer_const&>
                                    ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                      *)&pPVar3->framebuffers,iVar4,&local_1b4);
                        }
                        else {
                          (iVar4._M_current)->textures[3] = local_1b4.textures[3];
                          (iVar4._M_current)->textures_count = local_1b4.textures_count;
                          (iVar4._M_current)->textures[0] = local_1b4.textures[0];
                          *(undefined8 *)((iVar4._M_current)->textures + 1) =
                               local_1b4.textures._4_8_;
                          ppFVar1 = &(pPVar3->framebuffers).
                                     super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppFVar1 = *ppFVar1 + 1;
                        }
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_330,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs,"@ping");
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  (local_110,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_330);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330._0_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_320) {
                          operator_delete((void *)local_330._0_8_,
                                          (ulong)(local_320._M_allocated_capacity + 1));
                        }
                        local_330._4_4_ = 1;
                        local_330._0_4_ = uVar23;
                        std::
                        vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                        ::emplace_back<renderdesc::Command::Index>
                                  (&local_118->framebuffer,(Index *)local_330);
                        if (0 < (long)local_1b4.textures_count) {
                          lVar16 = 0;
                          do {
                            local_1b4.textures[lVar16] = local_1b4.textures[lVar16] + 1;
                            lVar16 = lVar16 + 1;
                          } while (local_1b4.textures_count != lVar16);
                        }
                        pPVar3 = local_258->pipeline_;
                        iVar4._M_current =
                             (pPVar3->framebuffers).
                             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        pFVar6 = (pPVar3->framebuffers).
                                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        if (iVar4._M_current ==
                            (pPVar3->framebuffers).
                            super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::
                          vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>::
                          _M_realloc_insert<renderdesc::Framebuffer_const&>
                                    ((vector<renderdesc::Framebuffer,std::allocator<renderdesc::Framebuffer>>
                                      *)&pPVar3->framebuffers,iVar4,&local_1b4);
                        }
                        else {
                          (iVar4._M_current)->textures[3] = local_1b4.textures[3];
                          (iVar4._M_current)->textures_count = local_1b4.textures_count;
                          (iVar4._M_current)->textures[0] = local_1b4.textures[0];
                          *(undefined8 *)((iVar4._M_current)->textures + 1) =
                               local_1b4.textures._4_8_;
                          ppFVar1 = &(pPVar3->framebuffers).
                                     super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppFVar1 = *ppFVar1 + 1;
                        }
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_330,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs,"@pong");
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  (local_110,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_330);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330._0_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_320) {
                          operator_delete((void *)local_330._0_8_,
                                          (ulong)(local_320._M_allocated_capacity + 1));
                        }
                        local_330._4_4_ = 0;
                        local_330._0_4_ =
                             (int)((ulong)((long)iVar4._M_current - (long)pFVar6) >> 2) *
                             -0x33333333;
                        std::
                        vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                        ::emplace_back<renderdesc::Command::Index>
                                  (&local_118->framebuffer,(Index *)local_330);
                      }
                      iVar22 = 0;
                    }
                  }
                  if ((local_180 == false) &&
                     ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_1a0._0_8_ !=
                      (vector<yaml::Value,_std::allocator<yaml::Value>_> *)(local_1a0 + 0x10))) {
                    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
                  }
                  if ((local_1c0 == false) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_1e0 + 0x10))) {
                    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                  }
                }
                if ((local_1e8 == false) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_208 + 0x10))) {
                  operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
                }
              }
              if ((local_260 == false) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_280 + 0x10))) {
                operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
              }
            }
            if ((local_158 == '\0') &&
               (local_178.value_._M_data !=
                (vector<yaml::Value,_std::allocator<yaml::Value>_> *)((long)&local_178 + 0x10))) {
              operator_delete((void *)local_178.value_._M_data,local_178._16_8_ + 1);
            }
          }
          if ((local_128 == false) && ((Mapping *)local_148._0_8_ != (Mapping *)(local_148 + 0x10)))
          {
            operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
          }
        }
        else {
          format_abi_cxx11_((string *)local_148,"Framebuffer \'%s\' is not unique",
                            *(undefined8 *)__rhs);
          if ((Mapping *)local_148._0_8_ == (Mapping *)(local_148 + 0x10)) {
            local_320._8_8_ = local_148._24_8_;
            local_330._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
          }
          else {
            local_330._0_8_ = local_148._0_8_;
          }
          local_320._M_allocated_capacity._1_7_ = local_148._17_7_;
          local_320._M_local_buf[0] = local_148[0x10];
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_0 = local_288;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320) {
            local_288->_M_allocated_capacity = local_320._M_allocated_capacity;
            *(undefined8 *)((long)local_288 + 8) = local_320._8_8_;
          }
          else {
            *(undefined8 *)&__return_storage_ptr__->field_0 = local_330._0_8_;
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                 local_320._M_allocated_capacity;
          }
          (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_148._8_8_;
          local_320._M_allocated_capacity = (ulong)(uint7)local_148._17_7_ << 8;
          __return_storage_ptr__->has_value_ = false;
          local_148[0x10] = '\0';
          local_148._8_8_ = 0;
          local_330._8_8_ = 0;
          iVar22 = 1;
          local_330._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320;
          local_148._0_8_ = (Mapping *)(local_148 + 0x10);
        }
        if (iVar22 != 0) goto LAB_0012bd1c;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != local_c8);
      iVar22 = 2;
LAB_0012bd1c:
      if (iVar22 != 2) goto LAB_0012bd26;
    }
    __return_storage_ptr__->has_value_ = true;
  }
LAB_0012bd26:
  if ((local_d8 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_f8)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> loadFramebuffers() {
		auto map_fb_result = root_.getMapping("framebuffers");
		if (!map_fb_result)
			return Unexpected(map_fb_result.error());

		for (const auto &[name, yfbv]: map_fb_result.value().get().map()) {
			if (std::find(names_.framebuffer.begin(), names_.framebuffer.end(), name) != names_.framebuffer.end())
				return Unexpected(format("Framebuffer '%s' is not unique", name.c_str()));

			auto yfb_result = yfbv.getMapping();
			if (!yfb_result)
				return Unexpected("Framebuffer " + name + " desc object is not a mapping");
			const yaml::Mapping &yfb = yfb_result.value();

			const size_t framebuffer_index = names_.framebuffer.size();
			assert(framebuffer_index == pipeline_.framebuffers.size());

			auto size_result = yfb.getSequence("size");
			if (!size_result)
				return Unexpected("Cannot read size for framebuffer " + name + ": " + size_result.error());
			const yaml::Sequence &size = size_result.value();

			if (size.size() != 2)
				return Unexpected("Framebuffer " + name + " size must have 2 elements");

			auto width_result = readVariable(size[0]);
			if (!width_result)
				return Unexpected("Cannot read width for framebuffer " + name + ": " + width_result.error());
			const int width = width_result.value();

			auto height_result = readVariable(size[1]);
			if (!height_result)
				return Unexpected("Cannot read height for framebuffer " + name + ": " + height_result.error());
			const int height = height_result.value();

			const auto pingpong_result = yfb.getInt("pingpong");
			const bool pingpong = pingpong_result && pingpong_result.value();

			auto textures_result = yfb.getSequence("textures");
			if (!textures_result)
				return Unexpected("Cannot read target textures for framebuffer " + name + ": " + textures_result.error());
			const yaml::Sequence &ytextures = textures_result.value();
			Framebuffer fb;
			fb.textures_count = 0;
			for (const auto &ytex: ytextures) {
				auto tex_result = ytex.getMapping();
				if (!tex_result)
					return Unexpected(format("%dth texture of framebuffer %s is not a mapping", fb.textures_count, name.c_str()));
				const yaml::Mapping &tex = tex_result.value();
				if (tex.map().size() != 1)
					return Unexpected("Framebuffer " + name + " target texture should have only one key:value pair: name and format");

				const auto &[tex_name, tex_type_name] = *tex.map().begin();
				if (fb.textures_count >= MAX_TARGET_TEXTURES)
					return Unexpected(format("Too many targets for framebuffer %s, max: %d",
						name.c_str(), MAX_TARGET_TEXTURES));

				auto tex_type_result = pixelTypeFromValue(tex_type_name);
				if (!tex_type_result)
					return Unexpected(format("Framebuffer %s texture %d has invalid pixel type: %s",
						name.c_str(), fb.textures_count, tex_type_result.error().c_str()));
				const PixelType tex_type = tex_type_result.value();

				const size_t tex_index = names_.texture.size();
				assert(tex_index == pipeline_.textures.size());

				Texture texture{width, height, tex_type};
				if (pingpong) {
					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Ping, name + "@ping." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}

					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Pong, name + "@pong." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}
				} else {
					auto result = registerTexture(tex_index, Command::Index::Pingpong::Fixed, name + "." + tex_name, texture);
					if (!result)
						return Unexpected(result.error());
				}

				fb.textures[fb.textures_count] = (int)tex_index;
				++fb.textures_count;
			}

			if (pingpong) {
				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@ping");
					indexes_.framebuffer.emplace_back(Command::Index(index, Command::Index::Pingpong::Ping));
				}

				for (int i = 0; i < fb.textures_count; ++i)
					fb.textures[i] += 1;

				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@pong");
					indexes_.framebuffer.emplace_back(Command::Index(index));
				}
			} else {
				const int index = (int)pipeline_.framebuffers.size();
				pipeline_.framebuffers.push_back(fb);
				names_.framebuffer.push_back(name);
				indexes_.framebuffer.emplace_back(Command::Index(index));
			}
		}

		return Expected<void, std::string>();
	}